

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall pbrt::SpotLight::PDF_Le(SpotLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar4 = 1.0 - this->cosFalloffStart;
  fVar3 = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  *pdfPos = 0.0;
  auVar6 = vfmadd132ss_fma(ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]),
                           ZEXT416((uint)((ray->d).super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->super_LightBase).renderFromLight.mInv.m[2][1])),
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]
                                         ),
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z));
  fVar1 = this->cosFalloffStart;
  fVar8 = auVar6._0_4_;
  if (fVar1 <= fVar8) {
    fVar7 = fVar4 * (1.0 / ((1.0 - fVar1) * 6.2831855));
    fVar4 = fVar4 + fVar3;
  }
  else {
    fVar7 = 0.0;
    if ((fVar8 <= fVar1) && (fVar2 = this->cosFalloffEnd, fVar2 <= fVar8)) {
      if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
        auVar9._0_4_ = (fVar8 - fVar2) / (fVar1 - fVar2);
        auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
        auVar10._0_12_ = ZEXT812(0);
        auVar10._12_4_ = 0;
        uVar5 = vcmpss_avx512f(auVar9,auVar10,1);
        fVar8 = (float)((uint)!(bool)((byte)uVar5 & 1) * auVar6._0_4_);
        auVar6._0_4_ = fVar8;
        auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar6,ZEXT416(0x40400000));
        fVar7 = fVar8 * fVar8 * auVar6._0_4_;
      }
      else {
        uVar5 = vcmpss_avx512f(auVar6,ZEXT416((uint)fVar2),5);
        fVar7 = (float)((uint)((byte)uVar5 & 1) * 0x3f800000);
      }
      fVar7 = (2.0 / (fVar1 - fVar2)) * fVar7;
    }
    fVar7 = fVar3 * fVar7;
    fVar4 = (fVar4 + fVar3) * 6.2831855;
  }
  *pdfDir = fVar7 / fVar4;
  return;
}

Assistant:

void SpotLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    *pdfPos = 0;
    // Find spotlight directional PDF based on $\cos \theta$
    Float cosTheta = CosTheta(renderFromLight.ApplyInverse(ray.d));
    if (cosTheta >= cosFalloffStart)
        *pdfDir = UniformConePDF(cosFalloffStart) * p[0] / (p[0] + p[1]);
    else
        *pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) * p[1] /
                  ((p[0] + p[1]) * (2 * Pi));
}